

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O2

uint * Dau_ReadFile(char *pFileName,int nSizeW)

{
  abctime aVar1;
  FILE *__stream;
  uint *__ptr;
  abctime aVar2;
  abctime time;
  
  aVar1 = Abc_Clock();
  __stream = fopen(pFileName,"rb");
  __ptr = (uint *)calloc((long)nSizeW,8);
  if (__stream == (FILE *)0x0) {
    printf("Cannot open input file \"%s\".\n",pFileName);
  }
  else {
    fread(__ptr,8,(long)nSizeW,__stream);
    printf("Finished reading file \"%s\".\n",pFileName);
    fclose(__stream);
  }
  aVar2 = Abc_Clock();
  Abc_PrintTime(0x81137c,(char *)(aVar2 - aVar1),time);
  return __ptr;
}

Assistant:

unsigned * Dau_ReadFile( char * pFileName, int nSizeW )
{
    abctime clk = Abc_Clock();
    FILE * pFile = fopen( pFileName, "rb" );
    unsigned * p = (unsigned *)ABC_CALLOC(word, nSizeW);
    int RetValue = pFile ? fread( p, sizeof(word), nSizeW, pFile ) : 0;
    RetValue = 0;
    if ( pFile )
    {
        printf( "Finished reading file \"%s\".\n", pFileName );
        fclose( pFile );
    }
    else
        printf( "Cannot open input file \"%s\".\n", pFileName );
    Abc_PrintTime( 1, "File reading", Abc_Clock() - clk );
    return p;
}